

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

int stbir__get_filter_pixel_width(stbir_filter filter,float scale)

{
  int iVar1;
  float fVar2;
  double dVar3;
  float scale_local;
  stbir_filter filter_local;
  
  if (filter == STBIR_FILTER_DEFAULT) {
    __assert_fail("filter != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x375,"int stbir__get_filter_pixel_width(stbir_filter, float)");
  }
  if (filter < (STBIR_FILTER_CATMULLROM|STBIR_FILTER_TRIANGLE)) {
    iVar1 = stbir__use_upsampling(scale);
    if (iVar1 == 0) {
      fVar2 = (*stbir__filter_info_table[filter].support)(scale);
      dVar3 = ceil((double)((fVar2 * 2.0) / scale));
    }
    else {
      fVar2 = (*stbir__filter_info_table[filter].support)(1.0 / scale);
      dVar3 = ceil((double)(fVar2 * 2.0));
    }
    scale_local = (float)(int)dVar3;
    return (int)scale_local;
  }
  __assert_fail("filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                ,0x376,"int stbir__get_filter_pixel_width(stbir_filter, float)");
}

Assistant:

static int stbir__get_filter_pixel_width(stbir_filter filter, float scale)
{
    STBIR_ASSERT(filter != 0);
    STBIR_ASSERT(filter < STBIR__ARRAY_SIZE(stbir__filter_info_table));

    if (stbir__use_upsampling(scale))
        return (int)ceil(stbir__filter_info_table[filter].support(1/scale) * 2);
    else
        return (int)ceil(stbir__filter_info_table[filter].support(scale) * 2 / scale);
}